

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildBestPriceVectorEnterDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  pointer pIVar6;
  int *piVar7;
  IdxElement *keys;
  undefined8 uVar8;
  type_conflict5 tVar9;
  uint uVar10;
  DataKey DVar11;
  ulong uVar12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  long lVar13;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  cpp_dec_float<100U,_int,_void> *local_1f0;
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  *local_1e8;
  pointer local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  value_type local_17c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  devexpr local_88 [8];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  local_248.m_backend.fpclass = cpp_dec_float_finite;
  local_248.m_backend.prec_elem = 0x10;
  local_248.m_backend.data._M_elems[0] = 0;
  local_248.m_backend.data._M_elems[1] = 0;
  local_248.m_backend.data._M_elems[2] = 0;
  local_248.m_backend.data._M_elems[3] = 0;
  local_248.m_backend.data._M_elems[0xc] = 0;
  local_248.m_backend.data._M_elems[0xd] = 0;
  local_248.m_backend.data._M_elems._56_5_ = 0;
  local_248.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_248.m_backend.exp = 0;
  local_248.m_backend.neg = false;
  local_248.m_backend.data._M_elems[4] = 0;
  local_248.m_backend.data._M_elems[5] = 0;
  local_248.m_backend.data._M_elems[6] = 0;
  local_248.m_backend.data._M_elems[7] = 0;
  local_248.m_backend.data._M_elems[8] = 0;
  local_248.m_backend.data._M_elems[9] = 0;
  local_248.m_backend.data._M_elems[10] = 0;
  local_248.m_backend.data._M_elems[0xb] = 0;
  pSVar4 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar5 = (pSVar4->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1e0 = (pSVar4->coWeights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_17c.val.m_backend.fpclass = cpp_dec_float_finite;
  local_17c.val.m_backend.prec_elem = 0x10;
  local_17c.val.m_backend.data._M_elems[0] = 0;
  local_17c.val.m_backend.data._M_elems[1] = 0;
  local_17c.val.m_backend.data._M_elems[2] = 0;
  local_17c.val.m_backend.data._M_elems[3] = 0;
  local_17c.val.m_backend.data._M_elems[4] = 0;
  local_17c.val.m_backend.data._M_elems[5] = 0;
  local_17c.val.m_backend.data._M_elems[6] = 0;
  local_17c.val.m_backend.data._M_elems[7] = 0;
  local_17c.val.m_backend.data._M_elems[0xc] = 0;
  local_17c.val.m_backend.data._M_elems[0xd] = 0;
  local_17c.val.m_backend.data._M_elems._56_5_ = 0;
  local_17c.val.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_17c.val.m_backend.exp = 0;
  local_17c.val.m_backend.neg = false;
  local_17c.val.m_backend.data._M_elems[8] = 0;
  local_17c.val.m_backend.data._M_elems[9] = 0;
  local_17c.val.m_backend.data._M_elems[10] = 0;
  local_17c.val.m_backend.data._M_elems[0xb] = 0;
  pIVar6 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->prices).data.
      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar6) {
    (this->prices).data.
    super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar6;
  }
  (this->bestPrices).super_IdxSet.num = 0;
  local_1e8 = &this->prices;
  uVar12 = (ulong)(uint)(pSVar4->infeasibilities).super_IdxSet.num;
  local_1f0 = &best->m_backend;
  for (; 0 < (int)uVar12; uVar12 = uVar12 - 1) {
    iVar2 = (((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->infeasibilities).super_IdxSet.idx[uVar12 - 1];
    local_248.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
    local_248.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
    local_248.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_248.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x20);
    local_248.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_248.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x30);
    local_248.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar8 = *(undefined8 *)(puVar1 + 2);
    local_248.m_backend.data._M_elems._56_5_ = SUB85(uVar8,0);
    local_248.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
    local_248.m_backend.exp = pnVar5[iVar2].m_backend.exp;
    local_248.m_backend.neg = pnVar5[iVar2].m_backend.neg;
    local_248.m_backend.fpclass = pnVar5[iVar2].m_backend.fpclass;
    local_248.m_backend.prec_elem = pnVar5[iVar2].m_backend.prec_elem;
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
    result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
    result.m_backend.data._M_elems._40_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 10)
    ;
    result.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
    result.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar9 = boost::multiprecision::operator<(&local_248,&result);
    pSVar4 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    if (tVar9) {
      (pSVar4->isInfeasible).data[iVar2] = 1;
      uStack_50 = CONCAT35(local_248.m_backend.data._M_elems[0xf]._1_3_,
                           local_248.m_backend.data._M_elems._56_5_);
      local_88 = (devexpr  [8])local_248.m_backend.data._M_elems._0_8_;
      auStack_80[0] = local_248.m_backend.data._M_elems[2];
      auStack_80[1] = local_248.m_backend.data._M_elems[3];
      local_78[0] = local_248.m_backend.data._M_elems[4];
      local_78[1] = local_248.m_backend.data._M_elems[5];
      auStack_70[0] = local_248.m_backend.data._M_elems[6];
      auStack_70[1] = local_248.m_backend.data._M_elems[7];
      local_68[0] = local_248.m_backend.data._M_elems[8];
      local_68[1] = local_248.m_backend.data._M_elems[9];
      auStack_60[0] = local_248.m_backend.data._M_elems[10];
      auStack_60[1] = local_248.m_backend.data._M_elems[0xb];
      local_58[0] = local_248.m_backend.data._M_elems[0xc];
      local_58[1] = local_248.m_backend.data._M_elems[0xd];
      local_48 = local_248.m_backend.exp;
      local_44 = local_248.m_backend.neg;
      local_40 = local_248.m_backend.fpclass;
      iStack_3c = local_248.m_backend.prec_elem;
      local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_1e0[iVar2].m_backend.data;
      local_d8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&local_1e0[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&local_1e0[iVar2].m_backend.data + 0x10);
      local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&local_1e0[iVar2].m_backend.data + 0x20);
      local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&local_1e0[iVar2].m_backend.data + 0x30);
      local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_d8.m_backend.exp = local_1e0[iVar2].m_backend.exp;
      local_d8.m_backend.neg = local_1e0[iVar2].m_backend.neg;
      local_d8.m_backend.fpclass = local_1e0[iVar2].m_backend.fpclass;
      local_d8.m_backend.prec_elem = local_1e0[iVar2].m_backend.prec_elem;
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_128.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_128.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_128.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_128.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_128.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      local_128.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      local_128.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      local_128.m_backend.exp = (feastol->m_backend).exp;
      local_128.m_backend.neg = (feastol->m_backend).neg;
      local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
      local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      local_17c.idx = iVar2;
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_88,&local_d8,&local_128,in_R8);
      local_17c.val.m_backend.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
      local_17c.val.m_backend.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
      local_17c.val.m_backend.data._M_elems._56_5_ = result.m_backend.data._M_elems._56_5_;
      local_17c.val.m_backend.data._M_elems[0xf]._1_3_ = result.m_backend.data._M_elems[0xf]._1_3_;
      local_17c.val.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
      local_17c.val.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
      local_17c.val.m_backend.data._M_elems[10] = result.m_backend.data._M_elems[10];
      local_17c.val.m_backend.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
      local_17c.val.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_17c.val.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_17c.val.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
      local_17c.val.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
      local_17c.val.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_17c.val.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_17c.val.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_17c.val.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_17c.val.m_backend.exp = result.m_backend.exp;
      local_17c.val.m_backend.neg = result.m_backend.neg;
      local_17c.val.m_backend.fpclass = result.m_backend.fpclass;
      local_17c.val.m_backend.prec_elem = result.m_backend.prec_elem;
      std::
      vector<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ::push_back(&local_1e8->data,&local_17c);
    }
    else {
      piVar7 = (pSVar4->infeasibilities).super_IdxSet.idx;
      iVar3 = (pSVar4->infeasibilities).super_IdxSet.num;
      (pSVar4->infeasibilities).super_IdxSet.num = iVar3 + -1;
      piVar7[uVar12 - 1] = piVar7[(long)iVar3 + -1];
      (pSVar4->isInfeasible).data[iVar2] = 0;
    }
  }
  keys = (this->prices).data.
         super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pIVar6 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).compare.elements = keys;
  lVar13 = 0;
  uVar10 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                     (keys,&(this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).compare,0,(int)(((long)pIVar6 - (long)keys) / 0x54),100,0,0,true);
  uVar12 = 0;
  if (0 < (int)uVar10) {
    uVar12 = (ulong)uVar10;
  }
  for (; uVar12 * 0x54 - lVar13 != 0; lVar13 = lVar13 + 0x54) {
    DIdxSet::addIdx(&this->bestPrices,
                    *(int *)((long)&(((this->prices).data.
                                      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->val).m_backend +
                            lVar13 + -4));
    (((this->
      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thesolver)->isInfeasible).data
    [*(int *)((long)&(((this->prices).data.
                       super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                       ._M_impl.super__Vector_impl_data._M_start)->val).m_backend + lVar13 + -4)] =
         2;
  }
  if ((int)uVar10 < 1) {
    DVar11.info = 0;
    DVar11.idx = -1;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (local_1f0,
               &(((this->prices).data.
                  super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                  ._M_impl.super__Vector_impl_data._M_start)->val).m_backend);
    DVar11 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::coId((this->
                             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).thesolver,
                             ((this->prices).data.
                              super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                              ._M_impl.super__Vector_impl_data._M_start)->idx);
  }
  return (SPxId)DVar11;
}

Assistant:

SPxId SPxDevexPR<R>::buildBestPriceVectorEnterDim(R& best, R feastol)
{
   int idx;
   int nsorted;
   R x;
   const R* coTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   typename SPxPricer<R>::IdxElement price;
   prices.clear();
   bestPrices.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = coTest[idx];

      if(x < -feastol)
      {
         this->thesolver->isInfeasible[idx] = this->VIOLATED;
         price.idx = idx;
         price.val = devexpr::computePrice(x, cpen[idx], feastol);
         prices.append(price);
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < prices.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(prices[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(prices[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = prices.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(prices.get_ptr(), this->compare, 0, prices.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPrices.addIdx(prices[i].idx);
      this->thesolver->isInfeasible[prices[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = prices[0].val;
      return this->thesolver->coId(prices[0].idx);
   }
   else
      return SPxId();
}